

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Pool_executor_factory::Pool_executor_factory(Pool_executor_factory *this,uint numthreads)

{
  uint numthreads_local;
  Pool_executor_factory *this_local;
  
  Executor_factory_base::Executor_factory_base(&this->super_Executor_factory_base);
  (this->super_Executor_factory_base)._vptr_Executor_factory_base =
       (_func_int **)&PTR__Pool_executor_factory_00251fc0;
  boost::thread_group::thread_group(&this->threads);
  std::
  vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
  ::vector(&this->pool);
  std::deque<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::deque
            (&this->req_queue);
  boost::mutex::mutex(&this->req_queue_lock);
  boost::condition_variable_any::condition_variable_any(&this->req_queue_cond);
  this->in_destructor = false;
  boost::mutex::mutex(&this->destructor_lock);
  add_threads(this,numthreads);
  return;
}

Assistant:

Pool_executor_factory::Pool_executor_factory(unsigned numthreads):
  in_destructor(false)
{
  add_threads(numthreads);
}